

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  long lVar2;
  ostream *poVar3;
  pointer pMVar4;
  undefined4 in_register_00000034;
  ColourGuard local_58;
  pluralise local_48;
  
  pMVar4 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    lVar2 = (long)pMVar1 - (long)pMVar4;
    poVar3 = this->stream;
    local_58.m_colourImpl = this->colourImpl;
    local_58.m_engaged = true;
    local_58.m_code = colour;
    (*(local_58.m_colourImpl)->_vptr_ColourImpl[2])
              (local_58.m_colourImpl,CONCAT44(in_register_00000034,colour),lVar2 % 0x48);
    poVar3 = std::operator<<(poVar3," with ");
    local_48.m_label.m_start = "message";
    local_48.m_label.m_size = 7;
    local_48.m_count = (uint64_t)(lVar2 / 0x48);
    Catch::operator<<(poVar3,&local_48);
    std::operator<<(poVar3,':');
    ColourImpl::ColourGuard::~ColourGuard(&local_58);
    while (pMVar4 = (this->itMessage)._M_current, pMVar4 != pMVar1) {
      if ((this->printInfoMessages != false) || (pMVar4->type != Info)) {
        poVar3 = std::operator<<(this->stream," \'");
        poVar3 = std::operator<<(poVar3,(string *)&((this->itMessage)._M_current)->message);
        std::operator<<(poVar3,'\'');
        pMVar4 = (this->itMessage)._M_current + 1;
        (this->itMessage)._M_current = pMVar4;
        if (pMVar4 != pMVar1) {
          poVar3 = this->stream;
          local_48.m_count = (uint64_t)this->colourImpl;
          local_48.m_label.m_start = (char *)CONCAT35(local_48.m_label.m_start._5_3_,0x100000017);
          (*((ColourImpl *)local_48.m_count)->_vptr_ColourImpl[2])(local_48.m_count,0x17);
          std::operator<<(poVar3," and");
          ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }